

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O0

upb_FieldDef ** upb_DefPool_GetAllExtensions(upb_DefPool *s,upb_MessageDef *m,size_t *count)

{
  _Bool _Var1;
  upb_FieldDef **ppuVar2;
  upb_FieldDef *puVar3;
  upb_MessageDef *puVar4;
  upb_FieldDef *f_1;
  size_t i;
  upb_FieldDef **exts;
  upb_FieldDef *f;
  upb_value val;
  uintptr_t key;
  intptr_t iter;
  size_t n;
  size_t *count_local;
  upb_MessageDef *m_local;
  upb_DefPool *s_local;
  
  iter = 0;
  key = 0xffffffffffffffff;
  n = (size_t)count;
  count_local = (size_t *)m;
  m_local = (upb_MessageDef *)s;
  while (_Var1 = upb_inttable_next((upb_inttable *)&(m_local->itof).t.entries,&val.val,
                                   (upb_value *)&f,(intptr_t *)&key), _Var1) {
    puVar3 = (upb_FieldDef *)upb_value_getconstptr((upb_value)f);
    puVar4 = upb_FieldDef_ContainingType(puVar3);
    if (puVar4 == (upb_MessageDef *)count_local) {
      iter = iter + 1;
    }
  }
  ppuVar2 = (upb_FieldDef **)upb_gmalloc(iter << 3);
  key = 0xffffffffffffffff;
  f_1 = (upb_FieldDef *)0x0;
  while (_Var1 = upb_inttable_next((upb_inttable *)&(m_local->itof).t.entries,&val.val,
                                   (upb_value *)&f,(intptr_t *)&key), _Var1) {
    puVar3 = (upb_FieldDef *)upb_value_getconstptr((upb_value)f);
    puVar4 = upb_FieldDef_ContainingType(puVar3);
    if (puVar4 == (upb_MessageDef *)count_local) {
      ppuVar2[(long)f_1] = puVar3;
      f_1 = (upb_FieldDef *)((long)&f_1->opts + 1);
    }
  }
  *(intptr_t *)n = iter;
  return ppuVar2;
}

Assistant:

const upb_FieldDef** upb_DefPool_GetAllExtensions(const upb_DefPool* s,
                                                  const upb_MessageDef* m,
                                                  size_t* count) {
  size_t n = 0;
  intptr_t iter = UPB_INTTABLE_BEGIN;
  uintptr_t key;
  upb_value val;
  // This is O(all exts) instead of O(exts for m).  If we need this to be
  // efficient we may need to make extreg into a two-level table, or have a
  // second per-message index.
  while (upb_inttable_next(&s->exts, &key, &val, &iter)) {
    const upb_FieldDef* f = upb_value_getconstptr(val);
    if (upb_FieldDef_ContainingType(f) == m) n++;
  }
  const upb_FieldDef** exts = upb_gmalloc(n * sizeof(*exts));
  iter = UPB_INTTABLE_BEGIN;
  size_t i = 0;
  while (upb_inttable_next(&s->exts, &key, &val, &iter)) {
    const upb_FieldDef* f = upb_value_getconstptr(val);
    if (upb_FieldDef_ContainingType(f) == m) exts[i++] = f;
  }
  *count = n;
  return exts;
}